

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_interface(writer *w,TypeDef *type)

{
  uint32_t *puVar1;
  bool bVar2;
  anon_class_8_1_89897ddb_conflict4 local_e0;
  anon_class_8_1_89897ddb_conflict4 local_d8;
  anon_class_8_1_89897ddb local_d0;
  anon_class_8_1_89897ddb_conflict4 local_c8;
  anon_class_8_1_89897ddb local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  char *local_a8;
  char *format_1;
  char *pcStack_98;
  anon_class_8_1_89897ddb_conflict4 local_90;
  anon_class_8_1_89897ddb_conflict4 local_88 [3];
  anon_class_8_1_89897ddb_conflict4 local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  char *local_58;
  char *format;
  generic_param_guard guard;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  string_view type_name;
  TypeDef *type_local;
  writer *w_local;
  
  join_0x00000010_0x00000000_ = winmd::reader::TypeDef::TypeName(type);
  winmd::reader::TypeDef::GenericParam
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard,type);
  writer::push_generic_params
            ((writer *)&format,(pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)w);
  bVar2 = winmd::reader::empty<winmd::reader::GenericParam>
                    ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard);
  if (bVar2) {
    local_58 = 
    "    struct WINRT_IMPL_EMPTY_BASES % :\n        winrt::Windows::Foundation::IInspectable,\n        impl::consume_t<%>%\n    {\n        %(std::nullptr_t = nullptr) noexcept {}\n        %(void* ptr, take_ownership_from_abi_t) noexcept : winrt::Windows::Foundation::IInspectable(ptr, take_ownership_from_abi) {}\n%%    };\n"
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,
               "    struct WINRT_IMPL_EMPTY_BASES % :\n        winrt::Windows::Foundation::IInspectable,\n        impl::consume_t<%>%\n    {\n        %(std::nullptr_t = nullptr) noexcept {}\n        %(void* ptr, take_ownership_from_abi_t) noexcept : winrt::Windows::Foundation::IInspectable(ptr, take_ownership_from_abi) {}\n%%    };\n"
              );
    local_70 = bind<&cppwinrt::write_interface_requires,_const_winmd::reader::TypeDef_&>(type);
    local_88[0] = bind<&cppwinrt::write_interface_usings,_const_winmd::reader::TypeDef_&>(type);
    local_90 = bind<&cppwinrt::write_interface_extensions,_const_winmd::reader::TypeDef_&>(type);
    puVar1 = &generics.second.super_row_base<winmd::reader::GenericParam>.m_index;
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
              (&w->super_writer_base<cppwinrt::writer>,&local_68,
               (basic_string_view<char,_std::char_traits<char>_> *)puVar1,
               (basic_string_view<char,_std::char_traits<char>_> *)puVar1,&local_70,
               (basic_string_view<char,_std::char_traits<char>_> *)puVar1,
               (basic_string_view<char,_std::char_traits<char>_> *)puVar1,local_88,&local_90);
  }
  else {
    join_0x00000010_0x00000000_ =
         remove_tick((string_view *)
                     &generics.second.super_row_base<winmd::reader::GenericParam>.m_index);
    pcStack_98 = generics._32_8_;
    format_1 = (char *)generics.second.super_row_base<winmd::reader::GenericParam>._8_8_;
    local_a8 = 
    "    template <%>\n    struct WINRT_IMPL_EMPTY_BASES % :\n        winrt::Windows::Foundation::IInspectable,\n        impl::consume_t<%>%\n    {%\n        %(std::nullptr_t = nullptr) noexcept {}\n        %(void* ptr, take_ownership_from_abi_t) noexcept : winrt::Windows::Foundation::IInspectable(ptr, take_ownership_from_abi) {}\n%%    };\n"
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,
               "    template <%>\n    struct WINRT_IMPL_EMPTY_BASES % :\n        winrt::Windows::Foundation::IInspectable,\n        impl::consume_t<%>%\n    {%\n        %(std::nullptr_t = nullptr) noexcept {}\n        %(void* ptr, take_ownership_from_abi_t) noexcept : winrt::Windows::Foundation::IInspectable(ptr, take_ownership_from_abi) {}\n%%    };\n"
              );
    local_c0 = bind<&cppwinrt::write_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                         ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard);
    local_c8 = bind<&cppwinrt::write_interface_requires,_const_winmd::reader::TypeDef_&>(type);
    local_d0 = bind<&cppwinrt::write_generic_asserts,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                         ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard);
    local_d8 = bind<&cppwinrt::write_interface_usings,_const_winmd::reader::TypeDef_&>(type);
    local_e0 = bind<&cppwinrt::write_interface_extensions,_const_winmd::reader::TypeDef_&>(type);
    puVar1 = &generics.second.super_row_base<winmd::reader::GenericParam>.m_index;
    writer_base<cppwinrt::writer>::
    write<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::TypeDef,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
              (&w->super_writer_base<cppwinrt::writer>,&local_b8,&local_c0,
               (basic_string_view<char,_std::char_traits<char>_> *)puVar1,type,&local_c8,&local_d0,
               (basic_string_view<char,_std::char_traits<char>_> *)puVar1,
               (basic_string_view<char,_std::char_traits<char>_> *)puVar1,&local_d8,&local_e0);
  }
  writer::generic_param_guard::~generic_param_guard((generic_param_guard *)&format);
  return;
}

Assistant:

static void write_interface(writer& w, TypeDef const& type)
    {
        auto type_name = type.TypeName();
        auto generics = type.GenericParam();
        auto guard{ w.push_generic_params(generics) };

        if (empty(generics))
        {
            auto format = R"(    struct WINRT_IMPL_EMPTY_BASES % :
        winrt::Windows::Foundation::IInspectable,
        impl::consume_t<%>%
    {
        %(std::nullptr_t = nullptr) noexcept {}
        %(void* ptr, take_ownership_from_abi_t) noexcept : winrt::Windows::Foundation::IInspectable(ptr, take_ownership_from_abi) {}
%%    };
)";

            w.write(format,
                type_name,
                type_name,
                bind<write_interface_requires>(type),
                type_name,
                type_name,
                bind<write_interface_usings>(type),
                bind<write_interface_extensions>(type));
        }
        else
        {
            type_name = remove_tick(type_name);

            auto format = R"(    template <%>
    struct WINRT_IMPL_EMPTY_BASES % :
        winrt::Windows::Foundation::IInspectable,
        impl::consume_t<%>%
    {%
        %(std::nullptr_t = nullptr) noexcept {}
        %(void* ptr, take_ownership_from_abi_t) noexcept : winrt::Windows::Foundation::IInspectable(ptr, take_ownership_from_abi) {}
%%    };
)";

            w.write(format,
                bind<write_generic_typenames>(generics),
                type_name,
                type,
                bind<write_interface_requires>(type),
                bind<write_generic_asserts>(generics),
                type_name,
                type_name,
                bind<write_interface_usings>(type),
                bind<write_interface_extensions>(type));
        }
    }